

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<unsigned_int,kj::Canceler::AdapterImpl<unsigned_int>>::
AdapterPromiseNode<kj::Canceler&,kj::Promise<unsigned_int>>
          (AdapterPromiseNode<unsigned_int,kj::Canceler::AdapterImpl<unsigned_int>> *this,
          Canceler *params,Promise<unsigned_int> *params_1)

{
  Canceler *canceler;
  Promise<unsigned_int> *pPVar1;
  Promise<unsigned_int> local_30;
  Promise<unsigned_int> *local_20;
  Promise<unsigned_int> *params_local_1;
  Canceler *params_local;
  AdapterPromiseNode<unsigned_int,_kj::Canceler::AdapterImpl<unsigned_int>_> *this_local;
  
  local_20 = params_1;
  params_local_1 = (Promise<unsigned_int> *)params;
  params_local = (Canceler *)this;
  AdapterPromiseNodeBase::AdapterPromiseNodeBase((AdapterPromiseNodeBase *)this);
  PromiseFulfiller<unsigned_int>::PromiseFulfiller((PromiseFulfiller<unsigned_int> *)(this + 0x10));
  *(undefined ***)this = &PTR_onReady_007c7028;
  *(undefined ***)(this + 0x10) = &PTR_fulfill_007c7070;
  ExceptionOr<unsigned_int>::ExceptionOr((ExceptionOr<unsigned_int> *)(this + 0x18));
  this[0x180] = (AdapterPromiseNode<unsigned_int,kj::Canceler::AdapterImpl<unsigned_int>>)0x1;
  canceler = fwd<kj::Canceler&>((Canceler *)params_local_1);
  pPVar1 = fwd<kj::Promise<unsigned_int>>(local_20);
  Promise<unsigned_int>::Promise(&local_30,pPVar1);
  Canceler::AdapterImpl<unsigned_int>::AdapterImpl
            ((AdapterImpl<unsigned_int> *)(this + 0x188),
             (PromiseFulfiller<unsigned_int> *)(this + 0x10),canceler,&local_30);
  Promise<unsigned_int>::~Promise(&local_30);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}